

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_attr_chlist_t * __thiscall Imf_3_3::Context::channels(Context *this,int partidx)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream *text;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_attr_chlist_t *cl;
  exr_attr_chlist_t **in_stack_fffffffffffffe18;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe20;
  exr_const_context_t in_stack_fffffffffffffe28;
  stringstream local_1a0 [16];
  ostream local_190 [336];
  Context *in_stack_ffffffffffffffc0;
  exr_attr_chlist_t *local_18;
  
  std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe20);
  eVar1 = exr_get_channels(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20)
                           ,in_stack_fffffffffffffe18);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Unable to get the channel list for part ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    poVar2 = std::operator<<(poVar2," in file \'");
    pcVar3 = fileName(in_stack_ffffffffffffffc0);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\'");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return local_18;
}

Assistant:

const exr_attr_chlist_t*
Context::channels (int partidx) const
{
    const exr_attr_chlist_t* cl;

    if (EXR_ERR_SUCCESS != exr_get_channels (*_ctxt, partidx, &cl))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get the channel list for part "
                << partidx << " in file '" << fileName () << "'");
    }

    return cl;
}